

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinitions.h
# Opt level: O0

void __thiscall cmDefinitions::Def::Def(Def *this,char *v)

{
  char *local_40;
  allocator<char> local_19;
  char *local_18;
  char *v_local;
  Def *this_local;
  
  local_40 = v;
  if (v == (char *)0x0) {
    local_40 = "";
  }
  local_18 = v;
  v_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,local_40,&local_19);
  std::allocator<char>::~allocator(&local_19);
  this->Exists = (bool)(-(local_18 != (char *)0x0) & 1);
  this->Used = false;
  return;
}

Assistant:

Def(const char* v)
      : std_string(v ? v : "")
      , Exists(v ? true : false)
    {
    }